

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiEvent * __thiscall
smf::MidiFile::addKeySignature(MidiFile *this,int aTrack,int aTick,int fifths,bool mode)

{
  MidiEvent *this_00;
  reference ppMVar1;
  MidiEvent *me;
  bool mode_local;
  int fifths_local;
  int aTick_local;
  int aTrack_local;
  MidiFile *this_local;
  
  this_00 = (MidiEvent *)operator_new(0x38);
  MidiEvent::MidiEvent(this_00);
  MidiMessage::makeKeySignature((MidiMessage *)this_00,fifths,mode);
  this_00->tick = aTick;
  ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,(long)aTrack);
  MidiEventList::push_back_no_copy(*ppMVar1,this_00);
  return this_00;
}

Assistant:

MidiEvent* MidiFile::addKeySignature (int aTrack, int aTick, int fifths, bool mode) {
    MidiEvent* me = new MidiEvent;
    me->makeKeySignature(fifths, mode);
    me->tick = aTick;
    m_events[aTrack]->push_back_no_copy(me);
    return me;
}